

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O2

bool have_schar(char *arg)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  
  cVar3 = *arg;
  if (cVar3 == '\0') {
    bVar2 = false;
  }
  else {
    while( true ) {
      arg = arg + 1;
      bVar2 = cVar3 != '\0';
      if ((cVar3 == '\0') ||
         (((9 < (int)cVar3 - 0x30U && (iVar1 = isalpha((int)cVar3), cVar3 != ' ')) && (iVar1 == 0)))
         ) break;
      cVar3 = *arg;
    }
  }
  return bVar2;
}

Assistant:

bool have_schar(char *arg)
{
	if (*arg == '\0')
		return false;

	for (; *arg != '\0'; arg++)
	{
		if (!isdigit(*arg) && !isalpha(*arg) && *arg != ' ')
			return true;
	}

	return false;
}